

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmainwindowlayout.cpp
# Opt level: O1

QList<int> * __thiscall
QMainWindowLayoutState::indexOf
          (QList<int> *__return_storage_ptr__,QMainWindowLayoutState *this,QWidget *widget)

{
  int *piVar1;
  QWidget *toolBar;
  long lVar2;
  long in_FS_OFFSET;
  QArrayDataPointer<int> local_40;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (int *)0x0;
  (__return_storage_ptr__->d).size = 0;
  toolBar = (QWidget *)QMetaObject::cast((QObject *)&QToolBar::staticMetaObject);
  if (toolBar == (QWidget *)0x0) {
    lVar2 = QMetaObject::cast((QObject *)&QDockWidget::staticMetaObject);
    if (lVar2 == 0) {
      lVar2 = QMetaObject::cast((QObject *)&QDockWidgetGroupWindow::staticMetaObject);
      if (lVar2 == 0) goto LAB_00437f45;
    }
    QDockAreaLayout::indexOf((QList<int> *)&local_40,&this->dockAreaLayout,widget);
    QArrayDataPointer<int>::operator=(&__return_storage_ptr__->d,&local_40);
    piVar1 = (int *)CONCAT44(local_40.d._4_4_,local_40.d._0_4_);
    if (piVar1 != (int *)0x0) {
      LOCK();
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (*piVar1 == 0) {
        QArrayData::deallocate((QArrayData *)CONCAT44(local_40.d._4_4_,local_40.d._0_4_),4,0x10);
      }
    }
    if ((__return_storage_ptr__->d).size == 0) goto LAB_00437f45;
    local_40.d._0_4_ = 1;
  }
  else {
    QToolBarAreaLayout::indexOf((QList<int> *)&local_40,&this->toolBarAreaLayout,toolBar);
    QArrayDataPointer<int>::operator=(&__return_storage_ptr__->d,&local_40);
    piVar1 = (int *)CONCAT44(local_40.d._4_4_,local_40.d._0_4_);
    if (piVar1 != (int *)0x0) {
      LOCK();
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (*piVar1 == 0) {
        QArrayData::deallocate((QArrayData *)CONCAT44(local_40.d._4_4_,local_40.d._0_4_),4,0x10);
      }
    }
    if ((__return_storage_ptr__->d).size == 0) goto LAB_00437f45;
    local_40.d._0_4_ = 0;
  }
  QtPrivate::QPodArrayOps<int>::emplace<int&>
            ((QPodArrayOps<int> *)__return_storage_ptr__,0,(int *)&local_40);
LAB_00437f45:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QList<int> QMainWindowLayoutState::indexOf(QWidget *widget) const
{
    QList<int> result;

#if QT_CONFIG(toolbar)
    // is it a toolbar?
    if (QToolBar *toolBar = qobject_cast<QToolBar*>(widget)) {
        result = toolBarAreaLayout.indexOf(toolBar);
        if (!result.isEmpty())
            result.prepend(0);
        return result;
    }
#endif

#if QT_CONFIG(dockwidget)
    // is it a dock widget?
    if (qobject_cast<QDockWidget *>(widget) || qobject_cast<QDockWidgetGroupWindow *>(widget)) {
        result = dockAreaLayout.indexOf(widget);
        if (!result.isEmpty())
            result.prepend(1);
        return result;
    }
#endif // QT_CONFIG(dockwidget)

    return result;
}